

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON__UINT32 __thiscall
ON_WindingNumber::AddBoundary
          (ON_WindingNumber *this,size_t point_count,size_t point_stride,int *boundary_points,
          bool bCloseBoundary)

{
  ON__UINT32 OVar1;
  long lVar2;
  int *piVar3;
  ON_2dPoint p1;
  ON_2dPoint p0;
  double local_60;
  double dStack_58;
  int *local_50;
  double local_48;
  double dStack_40;
  
  OVar1 = this->m_boundary_segment_count;
  if ((((boundary_points != (int *)0x0) && (1 < point_stride)) && (1 < point_count)) &&
     (!NAN((this->m_winding_point).x))) {
    lVar2 = point_count * point_stride;
    local_60 = (double)*boundary_points;
    dStack_58 = (double)boundary_points[1];
    local_50 = boundary_points;
    if (lVar2 - point_stride != 0 && (long)point_stride <= lVar2) {
      piVar3 = boundary_points + point_stride;
      do {
        local_48 = local_60;
        dStack_40 = dStack_58;
        local_60 = (double)*piVar3;
        dStack_58 = (double)piVar3[1];
        Internal_AddBoundarySegment(this,&local_48,&local_60);
        piVar3 = piVar3 + point_stride;
      } while (piVar3 < boundary_points + lVar2);
    }
    if (bCloseBoundary) {
      local_48 = (double)*local_50;
      dStack_40 = (double)local_50[1];
      Internal_AddBoundarySegment(this,&local_60,&local_48);
    }
  }
  return this->m_boundary_segment_count - OVar1;
}

Assistant:

ON__UINT32 ON_WindingNumber::AddBoundary(size_t point_count, size_t point_stride, const int* boundary_points, bool bCloseBoundary)
{
  const ON__UINT32 boundary_segment_count0 = m_boundary_segment_count;
  if (Internal_HaveWindingPoint() && point_count >= 2 && point_stride >= 2 && nullptr != boundary_points)
  {
    ON_2dPoint p0, p1;
    const int* pmax = boundary_points + (point_count*point_stride);
    p1.x = boundary_points[0];
    p1.y = boundary_points[1];
    for (const int* p = boundary_points+point_stride; p < pmax; p += point_stride)
    {
      p0 = p1;
      p1.x = p[0];
      p1.y = p[1];
      Internal_AddBoundarySegment(&p0.x, &p1.x);
    }
    if (bCloseBoundary)
    {
      p0.x = boundary_points[0];
      p0.y = boundary_points[1];
      Internal_AddBoundarySegment(&p1.x, &p0.x);
    }
  }
  return (m_boundary_segment_count - boundary_segment_count0);
}